

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QModelIndex * __thiscall
QAbstractItemView::currentIndex(QModelIndex *__return_storage_ptr__,QAbstractItemView *this)

{
  bool bVar1;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)(*(long *)(this + 8) + 800));
  if (bVar1) {
    QItemSelectionModel::currentIndex();
  }
  else {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QAbstractItemView::currentIndex() const
{
    Q_D(const QAbstractItemView);
    return d->selectionModel ? d->selectionModel->currentIndex() : QModelIndex();
}